

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O3

void duckdb::alp::AlpCompression<double,_false>::Compress
               (double *input_vector,idx_t n_values,uint16_t *vector_null_positions,
               idx_t nulls_count,State *state)

{
  int64_t *piVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  uint32_t bit;
  reference pvVar5;
  int64_t iVar6;
  unsigned_long uVar7;
  long lVar8;
  ulong uVar9;
  ushort uVar10;
  uint32_t bit_00;
  ulong uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  int64_t *in;
  ulong uVar15;
  ulong uVar16;
  idx_t iVar17;
  double dVar18;
  long local_158;
  uint64_t local_138 [33];
  
  if ((ulong)(((long)(state->best_k_combinations).
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(state->best_k_combinations).
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 2) {
    pvVar5 = vector<duckdb::alp::AlpCombination,_true>::operator[](&state->best_k_combinations,0);
    state->vector_encoding_indices = pvVar5->encoding_indices;
  }
  else {
    FindBestFactorAndExponent(input_vector,n_values,state);
  }
  uVar12 = 0x7fffffffffffffff;
  if (n_values == 0) {
    iVar6 = 0;
  }
  else {
    uVar10 = 0;
    local_158 = 0x7ffffffffffffc00;
    iVar17 = 0;
    do {
      dVar2 = input_vector[iVar17];
      dVar18 = *(double *)
                (AlpTypedConstants<double>::EXP_ARR +
                (ulong)((ushort)state->vector_encoding_indices & 0xff) * 8) * dVar2 *
               *(double *)
                (AlpTypedConstants<double>::FRAC_ARR +
                (ulong)((ushort)state->vector_encoding_indices >> 8) * 8);
      bVar4 = IsImpossibleToEncode(dVar18);
      lVar8 = (long)(dVar18 + 6755399441055744.0 + -6755399441055744.0);
      if (bVar4) {
        lVar8 = local_158;
      }
      lVar3 = *(long *)(AlpConstants::FACT_ARR +
                       (ulong)((ushort)state->vector_encoding_indices >> 8) * 8);
      dVar18 = *(double *)
                (AlpTypedConstants<double>::FRAC_ARR +
                (ulong)((ushort)state->vector_encoding_indices & 0xff) * 8);
      state->encoded_integers[iVar17] = lVar8;
      state->exceptions_positions[uVar10] = (uint16_t)iVar17;
      uVar10 = uVar10 + ((double)lVar3 * (double)lVar8 * dVar18 != dVar2);
      iVar17 = iVar17 + 1;
    } while (n_values != iVar17);
    iVar6 = 0;
    uVar9 = 0;
    do {
      if (uVar9 != state->exceptions_positions[uVar9]) {
        iVar6 = state->encoded_integers[uVar9];
        break;
      }
      uVar9 = uVar9 + 1;
    } while (n_values != uVar9);
    if (uVar10 != 0) {
      uVar9 = 0;
      do {
        dVar2 = input_vector[state->exceptions_positions[uVar9]];
        state->encoded_integers[state->exceptions_positions[uVar9]] = iVar6;
        state->exceptions[uVar9] = dVar2;
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      goto LAB_00565752;
    }
  }
  uVar10 = 0;
LAB_00565752:
  state->exceptions_count = uVar10;
  if (nulls_count != 0) {
    iVar17 = 0;
    do {
      state->encoded_integers[vector_null_positions[iVar17]] = iVar6;
      iVar17 = iVar17 + 1;
    } while (nulls_count != iVar17);
  }
  if (n_values == 0) {
    bit = 1;
    uVar9 = 1;
    iVar17 = 0;
  }
  else {
    uVar14 = 0x8000000000000000;
    iVar17 = 0;
    uVar13 = uVar12;
    do {
      uVar12 = state->encoded_integers[iVar17];
      if ((long)uVar14 <= (long)uVar12) {
        uVar14 = uVar12;
      }
      if ((long)uVar13 < (long)uVar12) {
        uVar12 = uVar13;
      }
      iVar17 = iVar17 + 1;
      uVar13 = uVar12;
    } while (n_values != iVar17);
    uVar9 = uVar14 - uVar12;
    piVar1 = state->encoded_integers;
    iVar17 = 0;
    do {
      piVar1[iVar17] = piVar1[iVar17] - uVar12;
      iVar17 = iVar17 + 1;
    } while (n_values != iVar17);
    lVar8 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    bit_00 = 0x40;
    if (uVar9 >> 0x38 == 0) {
      bit_00 = (uint)(byte)(0x40 - ((byte)lVar8 ^ 0x3f));
    }
    bit = 0;
    if (uVar14 != uVar12) {
      bit = bit_00;
    }
    iVar17 = n_values;
    if ((n_values & 0x1f) != 0) {
      uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)n_values & 0x1f);
      iVar17 = (n_values - uVar7) + 0x20;
    }
    uVar9 = (ulong)(byte)bit;
    if (uVar14 != uVar12) {
      uVar9 = (ulong)(byte)bit;
      uVar15 = n_values & 0xffffffffffffffe0;
      if (uVar15 == 0) {
        uVar15 = 0;
      }
      else {
        uVar11 = 0;
        uVar16 = 0;
        in = piVar1;
        do {
          duckdb_fastpforlib::fastpack
                    ((uint64_t *)in,(uint32_t *)(state->values_encoded + (uVar11 >> 3)),bit_00);
          uVar16 = uVar16 + 0x20;
          in = in + 0x20;
          uVar11 = uVar11 + (bit << 5);
        } while (uVar16 < uVar15);
      }
      if ((n_values & 0x1f) != 0) {
        uVar11 = (ulong)(((uint)n_values & 0x1f) << 3);
        switchD_00569a20::default((void *)((long)local_138 + uVar11),0,0x100 - uVar11);
        switchD_00b041bd::default(local_138,piVar1 + uVar15,uVar11);
        duckdb_fastpforlib::fastpack
                  (local_138,(uint32_t *)(state->values_encoded + (uVar15 * uVar9 >> 3)),bit);
      }
    }
  }
  state->bit_width = (uint16_t)bit;
  state->bp_size = uVar9 * iVar17 >> 3;
  state->frame_of_reference = uVar12;
  return;
}

Assistant:

static void Compress(const T *input_vector, idx_t n_values, const uint16_t *vector_null_positions,
	                     idx_t nulls_count, State &state) {
		if (state.best_k_combinations.size() > 1) {
			FindBestFactorAndExponent(input_vector, n_values, state);
		} else {
			state.vector_encoding_indices = state.best_k_combinations[0].encoding_indices;
		}

		// Encoding Floating-Point to Int64
		//! We encode all the values regardless of their correctness to recover the original floating-point
		uint16_t exceptions_idx = 0;
		for (idx_t i = 0; i < n_values; i++) {
			T actual_value = input_vector[i];
			int64_t encoded_value = EncodeValue(actual_value, state.vector_encoding_indices);
			T decoded_value = DecodeValue(encoded_value, state.vector_encoding_indices);
			state.encoded_integers[i] = encoded_value;
			//! We detect exceptions using a predicated comparison
			auto is_exception = (decoded_value != actual_value);
			state.exceptions_positions[exceptions_idx] = UnsafeNumericCast<uint16_t>(i);
			exceptions_idx += is_exception;
		}

		// Finding first non exception value
		int64_t a_non_exception_value = 0;
		for (idx_t i = 0; i < n_values; i++) {
			if (i != state.exceptions_positions[i]) {
				a_non_exception_value = state.encoded_integers[i];
				break;
			}
		}
		// Replacing that first non exception value on the vector exceptions
		for (idx_t i = 0; i < exceptions_idx; i++) {
			idx_t exception_pos = state.exceptions_positions[i];
			T actual_value = input_vector[exception_pos];
			state.encoded_integers[exception_pos] = a_non_exception_value;
			state.exceptions[i] = actual_value;
		}
		state.exceptions_count = exceptions_idx;

		// Replacing nulls with that first non exception value
		for (idx_t i = 0; i < nulls_count; i++) {
			uint16_t null_value_pos = vector_null_positions[i];
			state.encoded_integers[null_value_pos] = a_non_exception_value;
		}

		// Analyze FFOR
		auto min_value = NumericLimits<int64_t>::Maximum();
		auto max_value = NumericLimits<int64_t>::Minimum();
		for (idx_t i = 0; i < n_values; i++) {
			max_value = MaxValue(max_value, state.encoded_integers[i]);
			min_value = MinValue(min_value, state.encoded_integers[i]);
		}
		uint64_t min_max_diff = (static_cast<uint64_t>(max_value) - static_cast<uint64_t>(min_value));

		auto *u_encoded_integers = reinterpret_cast<uint64_t *>(state.encoded_integers);
		auto const u_min_value = static_cast<uint64_t>(min_value);

		// Subtract FOR
		if (!EMPTY) { //! We only execute the FOR if we are writing the data
			for (idx_t i = 0; i < n_values; i++) {
				u_encoded_integers[i] -= u_min_value;
			}
		}

		auto bit_width = BitpackingPrimitives::MinimumBitWidth<uint64_t, false>(min_max_diff);
		auto bp_size = BitpackingPrimitives::GetRequiredSize(n_values, bit_width);
		if (!EMPTY && bit_width > 0) { //! We only execute the BP if we are writing the data
			BitpackingPrimitives::PackBuffer<uint64_t, false>(state.values_encoded, u_encoded_integers, n_values,
			                                                  bit_width);
		}
		state.bit_width = bit_width;                                 // in bits
		state.bp_size = bp_size;                                     // in bytes
		state.frame_of_reference = static_cast<uint64_t>(min_value); // understood this can be negative
	}